

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

ON_Plane * __thiscall
ON_SubDMeshFragment::SideFrame
          (ON_Plane *__return_storage_ptr__,ON_SubDMeshFragment *this,uint grid_side_index)

{
  byte bVar1;
  uint *puVar2;
  bool bVar3;
  long lVar4;
  ON_Plane *pOVar5;
  ON_Plane *pOVar6;
  uint uVar7;
  byte bVar8;
  
  bVar8 = 0;
  bVar1 = (this->m_grid).m_side_segment_count;
  if ((bVar1 != 0 && grid_side_index < 4) && ((this->m_grid).m_S != (uint *)0x0)) {
    uVar7 = (uint)(bVar1 >> 1) + grid_side_index * bVar1;
    ON_Plane::ON_Plane(__return_storage_ptr__);
    puVar2 = (this->m_grid).m_S;
    bVar3 = Internal_GetFrameHelper
                      (this,puVar2[uVar7],puVar2[((uVar7 < (uint)bVar1 << 2) - 1 | 1) + uVar7],
                       __return_storage_ptr__);
    if (bVar3) {
      return __return_storage_ptr__;
    }
    ON_Plane::~ON_Plane(__return_storage_ptr__);
  }
  pOVar5 = &ON_Plane::NanPlane;
  pOVar6 = __return_storage_ptr__;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pOVar6->origin).x = (pOVar5->origin).x;
    pOVar5 = (ON_Plane *)((long)pOVar5 + ((ulong)bVar8 * -2 + 1) * 8);
    pOVar6 = (ON_Plane *)((long)pOVar6 + (ulong)bVar8 * -0x10 + 8);
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_Plane ON_SubDMeshFragment::SideFrame(unsigned int grid_side_index) const
{
  const unsigned int count = m_grid.m_side_segment_count;
  if (grid_side_index < 4U && count > 0 && nullptr != m_grid.m_S)
  {
    const unsigned int S_dex = grid_side_index * count + count / 2U;
    const unsigned int S_dex1 = (S_dex < (4U * count)) ? (S_dex + 1U) : (S_dex - 1U);
    ON_Plane side_frame;
    if (Internal_GetFrameHelper(m_grid.m_S[S_dex], m_grid.m_S[S_dex1], side_frame))
      return side_frame;
  }

  return ON_Plane::NanPlane;
}